

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericitemmodel.cpp
# Opt level: O2

bool __thiscall
QGenericItemModel::moveColumns
          (QGenericItemModel *this,QModelIndex *sourceParent,int sourceColumn,int count,
          QModelIndex *destinationParent,int destinationColumn)

{
  bool bVar1;
  long in_FS_OFFSET;
  int destinationColumn_local;
  int count_local;
  int sourceColumn_local;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  destinationColumn_local = destinationColumn;
  count_local = count;
  sourceColumn_local = sourceColumn;
  bVar1 = QGenericItemModelImplBase::call<bool,QModelIndex,int,int,QModelIndex,int>
                    (*(QGenericItemModelImplBase **)(this + 0x10),MoveColumns,sourceParent,
                     &sourceColumn_local,&count_local,destinationParent,&destinationColumn_local);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QGenericItemModel::moveColumns(const QModelIndex &sourceParent, int sourceColumn, int count,
                                    const QModelIndex &destinationParent, int destinationColumn)
{
    return impl->call<bool>(QGenericItemModelImplBase::MoveColumns,
                            sourceParent, sourceColumn, count,
                            destinationParent, destinationColumn);
}